

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O1

void __thiscall
TPZStructMatrixOR<std::complex<double>_>::ThreadData::ComputedElementMatrix
          (ThreadData *this,int64_t iel,
          TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *ek,
          TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *ef)

{
  int iVar1;
  mapped_type *this_00;
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
  el;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> local_40;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> local_38;
  key_type local_2c;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->fMutexAccessElement);
  if (iVar1 == 0) {
    local_40 = (TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>)ek->fRef;
    LOCK();
    ((local_40.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_40.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_38 = (TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>)ef->fRef;
    LOCK();
    ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_2c = (key_type)iel;
    this_00 = std::
              map<int,_std::pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>_>_>_>
              ::operator[](&this->fSubmitted,&local_2c);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=(&this_00->first,&local_40);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=(&this_00->second,&local_38)
    ;
    TPZSemaphore::Post(&this->fAssembly);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer(&local_38);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer(&local_40);
    pthread_mutex_unlock((pthread_mutex_t *)&this->fMutexAccessElement);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void 
TPZStructMatrixOR<TVar>::ThreadData::ComputedElementMatrix(int64_t iel, TPZAutoPointer<TPZElementMatrixT<TVar>> &ek, TPZAutoPointer<TPZElementMatrixT<TVar>> &ef) {
    std::scoped_lock lock(fMutexAccessElement);
    std::pair< TPZAutoPointer<TPZElementMatrixT<TVar>>, TPZAutoPointer<TPZElementMatrixT<TVar>> > el(ek, ef);
    fSubmitted[iel] = el;
    fAssembly.Post();
}